

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O2

void __thiscall MT32Emu::PartialManager::~PartialManager(PartialManager *this)

{
  Partial **ppPVar1;
  Partial *this_00;
  Bit32u BVar2;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    BVar2 = Synth::getPartialCount(this->synth);
    ppPVar1 = this->partialTable;
    if (BVar2 <= uVar3) break;
    this_00 = ppPVar1[uVar3];
    if (this_00 != (Partial *)0x0) {
      Partial::~Partial(this_00);
    }
    operator_delete(this_00);
    if (this->freePolys[uVar3] != (Poly *)0x0) {
      operator_delete(this->freePolys[uVar3]);
    }
    uVar3 = uVar3 + 1;
  }
  if (ppPVar1 != (Partial **)0x0) {
    operator_delete__(ppPVar1);
  }
  if (this->inactivePartials != (int *)0x0) {
    operator_delete__(this->inactivePartials);
  }
  if (this->freePolys != (Poly **)0x0) {
    operator_delete__(this->freePolys);
    return;
  }
  return;
}

Assistant:

PartialManager::~PartialManager(void) {
	for (unsigned int i = 0; i < synth->getPartialCount(); i++) {
		delete partialTable[i];
		if (freePolys[i] != NULL) delete freePolys[i];
	}
	delete[] partialTable;
	delete[] inactivePartials;
	delete[] freePolys;
}